

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O2

void __thiscall ODDLParser::Property::~Property(Property *this)

{
  Text *this_00;
  Value *this_01;
  Reference *this_02;
  Property *this_03;
  
  this_00 = this->m_key;
  if (this_00 != (Text *)0x0) {
    Text::clear(this_00);
  }
  operator_delete(this_00);
  this_01 = this->m_value;
  if (this_01 != (Value *)0x0) {
    Value::~Value(this_01);
    operator_delete(this_01);
  }
  this_02 = this->m_ref;
  if (this_02 != (Reference *)0x0) {
    Reference::~Reference(this_02);
    operator_delete(this_02);
  }
  this_03 = this->m_next;
  if (this_03 != (Property *)0x0) {
    ~Property(this_03);
    operator_delete(this_03);
    return;
  }
  return;
}

Assistant:

Property::~Property() {
    delete m_key;
    if(m_value!=ddl_nullptr)
        delete m_value;
    if(m_ref!=ddl_nullptr)
        delete(m_ref);
    if(m_next!=ddl_nullptr)
        delete m_next;
}